

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
::subtractSmallestUncoveredElement
          (HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
           *this)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  logic_error *this_00;
  ulong uVar9;
  long lVar10;
  pointer pdVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t col;
  ulong uVar16;
  long lVar17;
  pointer pdVar18;
  pointer pdVar19;
  ulong uVar20;
  rep local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68 = (this->zero_cost_).rep_;
  if (*(ulong *)this == 0) {
    bVar12 = false;
  }
  else {
    uVar9 = *(ulong *)&this->field_0x8;
    pdVar4 = (this->cost_matrix_).
             super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = 0;
    bVar12 = false;
    pdVar19 = pdVar4;
    do {
      uVar16 = uVar20 + 0x3f;
      if (-1 < (long)uVar20) {
        uVar16 = uVar20;
      }
      if ((*(ulong *)(*(long *)&this->field_0x10 + ((long)uVar16 >> 6) * 8 + -8 +
                     (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar20 & 0x3f) & 1) == 0 && uVar9 != 0) {
        uVar16 = 0;
        pdVar11 = pdVar19;
        do {
          uVar13 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar13 = uVar16;
          }
          if ((*(ulong *)(*(long *)&this->field_0x38 + ((long)uVar13 >> 6) * 8 + -8 +
                         (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar16 & 0x3f) & 1) == 0) {
            pdVar18 = pdVar11;
            bVar8 = true;
            if (bVar12) {
              if (local_68 <= pdVar11->rep_) goto LAB_0011aec9;
              pdVar18 = pdVar4 + uVar9 * uVar20 + uVar16;
              bVar8 = bVar12;
            }
            bVar12 = bVar8;
            local_68 = pdVar18->rep_;
          }
LAB_0011aec9:
          uVar16 = uVar16 + 1;
          pdVar11 = pdVar11 + 1;
        } while (uVar9 != uVar16);
      }
      uVar20 = uVar20 + 1;
      pdVar19 = pdVar19 + uVar9;
    } while (uVar20 != *(ulong *)this);
  }
  if (!bVar12) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Hungarian algorithm: !found_minimum; this should never happen",""
              );
    std::logic_error::logic_error(this_00,(string *)local_50);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (*(long *)this != 0) {
    lVar5 = *(long *)&this->field_0x10;
    uVar9 = 0;
    lVar17 = 0;
    do {
      if (*(long *)&this->field_0x8 != 0) {
        uVar20 = uVar9 + 0x3f;
        if (-1 < (long)uVar9) {
          uVar20 = uVar9;
        }
        lVar6 = *(long *)&this->field_0x38;
        lVar7 = *(long *)&this->field_0x60;
        pdVar4 = (this->cost_matrix_).
                 super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          uVar13 = lVar17 + uVar16;
          uVar14 = *(ulong *)(lVar5 + ((long)uVar20 >> 6) * 8 +
                             (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8) &
                   1L << ((byte)uVar9 & 0x3f);
          if (uVar14 == 0) {
LAB_0011afcf:
            uVar14 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar14 = uVar16;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar14 >> 6) * 8 + -8 +
                           (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar16 & 0x3f) & 1) == 0) {
              lVar10 = pdVar4[lVar17 + uVar16].rep_ - local_68;
LAB_0011b006:
              pdVar4[lVar17 + uVar16].rep_ = lVar10;
              uVar14 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar14 = uVar13;
              }
              uVar15 = 1L << ((byte)uVar13 & 0x3f);
              lVar1 = lVar7 + ((long)uVar14 >> 6) * 8;
              lVar3 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
              if (lVar10 == (this->zero_cost_).rep_) {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 | uVar15;
              }
              else {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 & ~uVar15;
              }
            }
          }
          else {
            uVar15 = uVar16 + 0x3f;
            if (-1 < (long)uVar16) {
              uVar15 = uVar16;
            }
            if ((*(ulong *)(lVar6 + ((long)uVar15 >> 6) * 8 + -8 +
                           (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar16 & 0x3f) & 1) != 0) {
              lVar10 = pdVar4[lVar17 + uVar16].rep_ + local_68;
              goto LAB_0011b006;
            }
            if (uVar14 == 0) goto LAB_0011afcf;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < *(ulong *)&this->field_0x8);
        lVar17 = lVar17 + uVar16;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ulong *)this);
  }
  return;
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }